

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareDwa.cpp
# Opt level: O2

half toNonlinear(half linear)

{
  undefined4 in_EAX;
  float __x;
  float fVar1;
  undefined8 uStack_8;
  
  fVar1 = *(float *)(_imath_half_to_float_table + (ulong)linear._h * 4);
  if ((~linear._h & 0x7c00) == 0) {
    uStack_8 = 0;
  }
  else {
    __x = ABS(fVar1);
    uStack_8 = CONCAT44(*(undefined4 *)(&DAT_00198180 + (ulong)(fVar1 < 0.0) * 4),in_EAX);
    if (__x <= 1.0) {
      fVar1 = powf(__x,0.45454544);
    }
    else {
      fVar1 = logf(__x);
      fVar1 = fVar1 / 2.2 + 1.0;
    }
    Imath_3_2::half::half((half *)((long)&uStack_8 + 2),fVar1 * uStack_8._4_4_);
  }
  return (half)uStack_8._2_2_;
}

Assistant:

half
toNonlinear (half linear)
{
    float sign    = 1;
    float logBase = pow (2.7182818, 2.2);

    if ((float) linear < 0) { sign = -1; }

    if ((linear.bits () & 0x7c00) == 0x7c00) { return (half) 0.0; }

    if (fabs ((float) linear) <= 1.0f)
    {
        return (half) (sign * pow (fabs ((float) linear), 1.f / 2.2f));
    }

    return (half) (sign * (log (fabs ((float) linear)) / log (logBase) + 1.0f));
}